

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_CHOICE.c
# Opt level: O2

asn_dec_rval_t
CHOICE_decode_xer(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,void **struct_ptr,
                 char *opt_mname,void *buf_ptr,size_t size)

{
  short *psVar1;
  int *piVar2;
  asn_TYPE_member_s *paVar3;
  void *struct_ptr_00;
  short sVar4;
  xer_check_tag_e tcv;
  int iVar5;
  uint uVar6;
  ssize_t sVar7;
  void **ppvVar8;
  void **ppvVar9;
  ulong uVar11;
  size_t num_1;
  size_t sVar12;
  long lVar13;
  asn_dec_rval_t aVar14;
  undefined8 uStack_90;
  char *local_70;
  pxer_chunk_type_e ch_type;
  ber_tlv_len_t *local_58;
  asn_codec_ctx_t *local_50;
  void *local_48;
  int *local_40;
  void *memb_ptr;
  size_t sVar10;
  
  local_70 = opt_mname;
  if (opt_mname == (char *)0x0) {
    local_70 = td->xml_tag;
  }
  piVar2 = (int *)td->specifics;
  local_48 = *struct_ptr;
  local_50 = opt_codec_ctx;
  if (local_48 == (void *)0x0) {
    local_48 = calloc(1,(long)*piVar2);
    *struct_ptr = local_48;
    if (local_48 == (void *)0x0) {
      uStack_90 = 2;
      sVar12 = 0;
      goto LAB_00142298;
    }
  }
  psVar1 = (short *)((long)local_48 + (long)piVar2[1]);
  sVar4 = *(short *)((long)local_48 + (long)piVar2[1]);
  if (sVar4 == 0) {
    if (*local_70 == '\0') {
      *psVar1 = 1;
      sVar4 = 1;
    }
    else {
      sVar4 = 0;
    }
  }
  uVar11 = (ulong)(uint)(int)psVar1[1];
  local_40 = (int *)(psVar1 + 2);
  local_58 = (ber_tlv_len_t *)(psVar1 + 8);
  sVar12 = 0;
  while (struct_ptr_00 = local_48, sVar4 < 5) {
    iVar5 = (int)uVar11;
    if (sVar4 == 2) {
      paVar3 = td->elements;
      ppvVar8 = (void **)((long)paVar3[iVar5].memb_offset + (long)local_48);
      ppvVar9 = ppvVar8;
      if ((paVar3[iVar5].flags & ATF_POINTER) == ATF_NOFLAGS) {
        ppvVar9 = &memb_ptr;
        memb_ptr = ppvVar8;
      }
      aVar14 = (*(paVar3[iVar5].type)->xer_decoder)
                         (local_50,paVar3[iVar5].type,ppvVar9,paVar3[iVar5].name,buf_ptr,size);
      sVar10 = aVar14.consumed;
      uStack_90 = aVar14._0_8_;
      sVar12 = sVar12 + sVar10;
      if (aVar14.code != RC_OK) goto LAB_00142298;
      size = size - sVar10;
      buf_ptr = (void *)((long)buf_ptr + sVar10);
      _set_present_idx(struct_ptr_00,piVar2[2],piVar2[3],iVar5 + 1);
      *psVar1 = 3;
      sVar4 = *psVar1;
    }
    if ((sVar4 == 3) && (*local_70 == '\0')) {
LAB_0014227f:
      *psVar1 = 5;
      uStack_90 = 0;
      goto LAB_00142298;
    }
    sVar7 = xer_next_token(local_40,buf_ptr,size,&ch_type);
    if (sVar7 == -1) goto LAB_00142295;
    if (ch_type - PXER_TEXT < 2) {
LAB_001420be:
      size = size - sVar7;
      buf_ptr = (void *)((long)buf_ptr + sVar7);
      sVar12 = sVar12 + sVar7;
      goto LAB_001420c6;
    }
    if (ch_type == PXER_WMORE) {
      uStack_90 = 1;
      goto LAB_00142298;
    }
    tcv = xer_check_tag(buf_ptr,(int)sVar7,local_70);
    if (*psVar1 == 4) {
      iVar5 = xer_skip_unknown(tcv,local_58);
      switch(iVar5) {
      case 1:
        *psVar1 = 3;
      case 0:
        goto LAB_001420be;
      case 2:
        *psVar1 = 3;
        break;
      case -1:
        *psVar1 = 5;
        goto LAB_00142295;
      }
    }
    switch(tcv) {
    case XCT_OPENING:
      sVar4 = *psVar1;
      if (sVar4 == 0) {
        buf_ptr = (void *)((long)buf_ptr + sVar7);
        size = size - sVar7;
        sVar12 = sVar12 + sVar7;
        *psVar1 = 1;
        goto LAB_001420c6;
      }
      goto LAB_0014217c;
    case XCT_CLOSING:
      if (*psVar1 == 3) {
        sVar12 = sVar12 + sVar7;
        goto LAB_0014227f;
      }
    default:
switchD_00142165_caseD_3:
      goto LAB_0014228e;
    case XCT_UNKNOWN_OP:
    case XCT_UNKNOWN_BO:
      sVar4 = *psVar1;
LAB_0014217c:
      if (sVar4 != 1) goto switchD_00142165_caseD_3;
      lVar13 = 0x38;
      uVar11 = 0;
      while (uVar6 = td->elements_count, (long)uVar11 < (long)(int)uVar6) {
        tcv = xer_check_tag(buf_ptr,(int)sVar7,*(char **)((long)&td->elements->flags + lVar13));
        switch(tcv) {
        case XCT_OPENING:
        case XCT_BOTH:
          psVar1[1] = (short)uVar11;
          *psVar1 = 2;
          uVar6 = td->elements_count;
          goto LAB_001421ec;
        default:
          uVar6 = td->elements_count;
          goto LAB_0014220d;
        case XCT_UNKNOWN_OP:
        case XCT_UNKNOWN_BO:
          uVar11 = uVar11 + 1;
          lVar13 = lVar13 + 0x40;
        }
      }
LAB_001421ec:
      if (uVar6 == (uint)uVar11) {
LAB_0014220d:
        uVar11 = (ulong)uVar6;
        if (piVar2[10] == -1) goto switchD_00142165_caseD_3;
        sVar4 = 3;
        if ((tcv & XCT_CLOSING) == XCT_BROKEN) {
          *local_58 = 1;
          sVar4 = 4;
        }
        *psVar1 = sVar4;
        buf_ptr = (void *)((long)buf_ptr + sVar7);
        size = size - sVar7;
        sVar12 = sVar12 + sVar7;
      }
LAB_001420c6:
      sVar4 = *psVar1;
    }
  }
LAB_0014228e:
  *psVar1 = 5;
LAB_00142295:
  uStack_90 = 2;
LAB_00142298:
  aVar14.consumed = sVar12;
  aVar14._0_8_ = uStack_90;
  return aVar14;
}

Assistant:

asn_dec_rval_t
CHOICE_decode_xer(asn_codec_ctx_t *opt_codec_ctx, asn_TYPE_descriptor_t *td,
	void **struct_ptr, const char *opt_mname,
		const void *buf_ptr, size_t size) {
	/*
	 * Bring closer parts of structure description.
	 */
	asn_CHOICE_specifics_t *specs = (asn_CHOICE_specifics_t *)td->specifics;
	const char *xml_tag = opt_mname ? opt_mname : td->xml_tag;

	/*
	 * Parts of the structure being constructed.
	 */
	void *st = *struct_ptr;	/* Target structure. */
	asn_struct_ctx_t *ctx;	/* Decoder context */

	asn_dec_rval_t rval;		/* Return value of a decoder */
	ssize_t consumed_myself = 0;	/* Consumed bytes from ptr */
	int edx;			/* Element index */

	/*
	 * Create the target structure if it is not present already.
	 */
	if(st == 0) {
		st = *struct_ptr = CALLOC(1, specs->struct_size);
		if(st == 0) RETURN(RC_FAIL);
	}

	/*
	 * Restore parsing context.
	 */
	ctx = (asn_struct_ctx_t *)((char *)st + specs->ctx_offset);
	if(ctx->phase == 0 && !*xml_tag)
		ctx->phase = 1;	/* Skip the outer tag checking phase */

	/*
	 * Phases of XER/XML processing:
	 * Phase 0: Check that the opening tag matches our expectations.
	 * Phase 1: Processing body and reacting on closing tag.
	 * Phase 2: Processing inner type.
	 * Phase 3: Only waiting for closing tag.
	 * Phase 4: Skipping unknown extensions.
	 * Phase 5: PHASED OUT
	 */
	for(edx = ctx->step; ctx->phase <= 4;) {
		pxer_chunk_type_e ch_type;	/* XER chunk type */
		ssize_t ch_size;		/* Chunk size */
		xer_check_tag_e tcv;		/* Tag check value */
		asn_TYPE_member_t *elm;

		/*
		 * Go inside the member.
		 */
		if(ctx->phase == 2) {
			asn_dec_rval_t tmprval;
			void *memb_ptr;		/* Pointer to the member */
			void **memb_ptr2;	/* Pointer to that pointer */

			elm = &td->elements[edx];

			if(elm->flags & ATF_POINTER) {
				/* Member is a pointer to another structure */
				memb_ptr2 = (void **)((char *)st
					+ elm->memb_offset);
			} else {
				memb_ptr = (char *)st + elm->memb_offset;
				memb_ptr2 = &memb_ptr;
			}

			/* Start/Continue decoding the inner member */
			tmprval = elm->type->xer_decoder(opt_codec_ctx,
					elm->type, memb_ptr2, elm->name,
					buf_ptr, size);
			XER_ADVANCE(tmprval.consumed);
			ASN_DEBUG("XER/CHOICE: itdf: [%s] code=%d",
				elm->type->name, tmprval.code);
			if(tmprval.code != RC_OK)
				RETURN(tmprval.code);
			assert(_fetch_present_idx(st,
				specs->pres_offset, specs->pres_size) == 0);
			/* Record what we've got */
			_set_present_idx(st,
				specs->pres_offset, specs->pres_size, edx + 1);
			ctx->phase = 3;
			/* Fall through */
		}

		/* No need to wait for closing tag; special mode. */
		if(ctx->phase == 3 && !*xml_tag) {
			ctx->phase = 5;	/* Phase out */
			RETURN(RC_OK);
		}

		/*
		 * Get the next part of the XML stream.
		 */
		ch_size = xer_next_token(&ctx->context, buf_ptr, size, &ch_type);
		if(ch_size == -1) {
            RETURN(RC_FAIL);
        } else {
			switch(ch_type) {
			case PXER_WMORE:
                RETURN(RC_WMORE);
			case PXER_COMMENT:	/* Got XML comment */
			case PXER_TEXT:		/* Ignore free-standing text */
				XER_ADVANCE(ch_size);	/* Skip silently */
				continue;
			case PXER_TAG:
				break;	/* Check the rest down there */
			}
		}

		tcv = xer_check_tag(buf_ptr, ch_size, xml_tag);
		ASN_DEBUG("XER/CHOICE checked [%c%c%c%c] vs [%s], tcv=%d",
			ch_size>0?((const uint8_t *)buf_ptr)[0]:'?',
			ch_size>1?((const uint8_t *)buf_ptr)[1]:'?',
			ch_size>2?((const uint8_t *)buf_ptr)[2]:'?',
			ch_size>3?((const uint8_t *)buf_ptr)[3]:'?',
		xml_tag, tcv);

		/* Skip the extensions section */
		if(ctx->phase == 4) {
			ASN_DEBUG("skip_unknown(%d, %ld)",
				tcv, (long)ctx->left);
			switch(xer_skip_unknown(tcv, &ctx->left)) {
			case -1:
				ctx->phase = 5;
				RETURN(RC_FAIL);
				continue;
			case 1:
				ctx->phase = 3;
				/* Fall through */
			case 0:
				XER_ADVANCE(ch_size);
				continue;
			case 2:
				ctx->phase = 3;
				break;
			}
		}

		switch(tcv) {
		case XCT_BOTH:
			break;	/* No CHOICE? */
		case XCT_CLOSING:
			if(ctx->phase != 3)
				break;
			XER_ADVANCE(ch_size);
			ctx->phase = 5;	/* Phase out */
			RETURN(RC_OK);
		case XCT_OPENING:
			if(ctx->phase == 0) {
				XER_ADVANCE(ch_size);
				ctx->phase = 1;	/* Processing body phase */
				continue;
			}
			/* Fall through */
		case XCT_UNKNOWN_OP:
		case XCT_UNKNOWN_BO:

			if(ctx->phase != 1)
				break;	/* Really unexpected */

			/*
			 * Search which inner member corresponds to this tag.
			 */
			for(edx = 0; edx < td->elements_count; edx++) {
				elm = &td->elements[edx];
				tcv = xer_check_tag(buf_ptr,ch_size,elm->name);
				switch(tcv) {
				case XCT_BOTH:
				case XCT_OPENING:
					/*
					 * Process this member.
					 */
					ctx->step = edx;
					ctx->phase = 2;
					break;
				case XCT_UNKNOWN_OP:
				case XCT_UNKNOWN_BO:
					continue;
				default:
					edx = td->elements_count;
					break;	/* Phase out */
				}
				break;
			}
			if(edx != td->elements_count)
				continue;

			/* It is expected extension */
			if(specs->ext_start != -1) {
				ASN_DEBUG("Got anticipated extension");
				/*
				 * Check for (XCT_BOTH or XCT_UNKNOWN_BO)
				 * By using a mask. Only record a pure
				 * <opening> tags.
				 */
				if(tcv & XCT_CLOSING) {
					/* Found </extension> without body */
					ctx->phase = 3; /* Terminating */
				} else {
					ctx->left = 1;
					ctx->phase = 4; /* Skip ...'s */
				}
				XER_ADVANCE(ch_size);
				continue;
			}

			/* Fall through */
		default:
			break;
		}

		ASN_DEBUG("Unexpected XML tag [%c%c%c%c] in CHOICE [%s]"
			" (ph=%d, tag=%s)",
			ch_size>0?((const uint8_t *)buf_ptr)[0]:'?',
			ch_size>1?((const uint8_t *)buf_ptr)[1]:'?',
			ch_size>2?((const uint8_t *)buf_ptr)[2]:'?',
			ch_size>3?((const uint8_t *)buf_ptr)[3]:'?',
			td->name, ctx->phase, xml_tag);
		break;
	}

	ctx->phase = 5;	/* Phase out, just in case */
	RETURN(RC_FAIL);
}